

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_CopySubArray(JSContext *ctx,JSValue obj,int64_t to_pos,int64_t from_pos,int64_t count,int dir
                   )

{
  long lVar1;
  long lVar2;
  int iVar3;
  long idx;
  ulong uVar4;
  long idx_00;
  JSValue val;
  JSValue local_40;
  
  if (0 < count) {
    lVar1 = count + from_pos;
    lVar2 = count + to_pos;
    uVar4 = 0;
    do {
      idx = from_pos;
      idx_00 = to_pos;
      if (dir < 0) {
        idx = lVar1 + ~uVar4;
        idx_00 = ~uVar4 + lVar2;
      }
      iVar3 = JS_TryGetPropertyInt64(ctx,obj,idx,&local_40);
      if (iVar3 < 0) {
        return -1;
      }
      if (iVar3 == 0) {
        iVar3 = JS_DeletePropertyInt64(ctx,obj,idx_00,0x4000);
      }
      else {
        iVar3 = JS_SetPropertyInt64(ctx,obj,idx_00,local_40);
      }
      if (iVar3 < 0) {
        return -1;
      }
      uVar4 = uVar4 + 1;
      to_pos = to_pos + 1;
      from_pos = from_pos + 1;
      count = count + -1;
    } while (count != 0);
  }
  return 0;
}

Assistant:

static int JS_CopySubArray(JSContext *ctx,
                           JSValueConst obj, int64_t to_pos,
                           int64_t from_pos, int64_t count, int dir)
{
    int64_t i, from, to;
    JSValue val;
    int fromPresent;

    /* XXX: should special case fast arrays */
    for (i = 0; i < count; i++) {
        if (dir < 0) {
            from = from_pos + count - i - 1;
            to = to_pos + count - i - 1;
        } else {
            from = from_pos + i;
            to = to_pos + i;
        }
        fromPresent = JS_TryGetPropertyInt64(ctx, obj, from, &val);
        if (fromPresent < 0)
            goto exception;

        if (fromPresent) {
            if (JS_SetPropertyInt64(ctx, obj, to, val) < 0)
                goto exception;
        } else {
            if (JS_DeletePropertyInt64(ctx, obj, to, JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    return 0;

 exception:
    return -1;
}